

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall
TestSchema::readMap<avro::Parser<avro::ReaderImpl<avro::Validator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  int32_t iVar1;
  int64_t iVar2;
  ostream *poVar3;
  long lVar4;
  bool bVar5;
  string key;
  
  do {
    printNext(this,p);
    iVar2 = avro::ReaderImpl<avro::Validator>::readMapBlockSize(&p->reader_);
    poVar3 = std::operator<<((ostream *)&std::cout,"Size ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,'\n');
    lVar4 = 0;
    if (0 < iVar2) {
      lVar4 = iVar2;
    }
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      key.field_2._M_local_buf[0] = '\0';
      printNext(this,p);
      avro::ReaderImpl<avro::Validator>::readValue(&p->reader_,&key);
      printNext(this,p);
      iVar1 = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readInt(p);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&key);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&key);
    }
  } while (iVar2 != 0);
  return;
}

Assistant:

void readMap(Parser &p)
    {
        int64_t size = 0;
        do { 
            printNext(p);
            size = p.readMapBlockSize();
            std::cout << "Size " << size << '\n';
            for(int64_t i=0; i < size; ++i) {
                std::string key;
                printNext(p);
                p.readString(key);
                printNext(p);
                int32_t intval = p.readInt();
                std::cout << key << ":" << intval << '\n';
            }
        } while (size != 0);
    }